

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UI.cpp
# Opt level: O0

void __thiscall UI::setNodeProperties(UI *this,Vertex<std::pair<double,_double>_> *node,int id)

{
  GraphViewer *pGVar1;
  int iVar2;
  allocator local_c9;
  string local_c8 [39];
  allocator local_a1;
  string local_a0 [39];
  allocator local_79;
  string local_78 [55];
  allocator local_41;
  string local_40 [36];
  int local_1c;
  Vertex<std::pair<double,_double>_> *pVStack_18;
  int id_local;
  Vertex<std::pair<double,_double>_> *node_local;
  UI *this_local;
  
  local_1c = id;
  pVStack_18 = node;
  node_local = (Vertex<std::pair<double,_double>_> *)this;
  switch(node->tag) {
  case quinta:
    GraphViewer::setVertexSize(this->gv,id,10);
    iVar2 = local_1c;
    pGVar1 = this->gv;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"BLUE",&local_41);
    GraphViewer::setVertexColor(pGVar1,iVar2,(string *)local_40);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    break;
  case garagem:
    GraphViewer::setVertexSize(this->gv,id,10);
    iVar2 = local_1c;
    pGVar1 = this->gv;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,"ORANGE",&local_79);
    GraphViewer::setVertexColor(pGVar1,iVar2,(string *)local_78);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
    break;
  case cliente:
    GraphViewer::setVertexSize(this->gv,id,10);
    iVar2 = local_1c;
    pGVar1 = this->gv;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a0,"RED",&local_a1);
    GraphViewer::setVertexColor(pGVar1,iVar2,(string *)local_a0);
    std::__cxx11::string::~string(local_a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_a1);
    break;
  case none:
    GraphViewer::setVertexSize(this->gv,id,3);
    iVar2 = local_1c;
    pGVar1 = this->gv;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c8,"YELLOW",&local_c9);
    GraphViewer::setVertexColor(pGVar1,iVar2,(string *)local_c8);
    std::__cxx11::string::~string(local_c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  }
  return;
}

Assistant:

void UI::setNodeProperties(Vertex<coordinates> *node, int id) {
    switch (node->tag) {
        case quinta:
            gv->setVertexSize(id, 10);
            gv->setVertexColor(id, "BLUE");
            break;
        case garagem:
            gv->setVertexSize(id, 10);
            gv->setVertexColor(id, "ORANGE");
            break;
        case cliente:
            gv->setVertexSize(id, 10);
            gv->setVertexColor(id, "RED");
            break;
        case none:
            gv->setVertexSize(id, 3);
            gv->setVertexColor(id, "YELLOW");
            break;
    }
}